

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutual_info.c
# Opt level: O1

double * inform_local_mutual_info(int *series,size_t l,size_t n,int *b,double *mi,inform_error *err)

{
  int *piVar1;
  uint64_t uVar2;
  uint32_t *puVar3;
  bool bVar4;
  _Bool _Var5;
  double *__ptr;
  undefined8 *__ptr_00;
  inform_dist *piVar6;
  int *piVar7;
  size_t sVar8;
  ulong uVar9;
  int *piVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  inform_dist *local_60;
  
  _Var5 = check_arguments(series,l,n,b,err);
  if (!_Var5) {
    __ptr = mi;
    if (((mi == (double *)0x0) && (__ptr = (double *)malloc(n * 8), __ptr == (double *)0x0)) ||
       (__ptr_00 = (undefined8 *)malloc(l * 8), __ptr_00 == (undefined8 *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
    }
    else {
      bVar14 = l != 0;
      if (l == 0) {
        sVar8 = 1;
      }
      else {
        sVar8 = (size_t)*b;
        piVar6 = inform_dist_alloc(sVar8);
        *__ptr_00 = piVar6;
        if (piVar6 == (inform_dist *)0x0) {
          uVar13 = 0;
        }
        else {
          uVar13 = 0;
          do {
            if (l - 1 == uVar13) {
              bVar14 = false;
              goto LAB_0010555f;
            }
            sVar8 = sVar8 * (long)b[uVar13 + 1];
            piVar6 = inform_dist_alloc((long)b[uVar13 + 1]);
            __ptr_00[uVar13 + 1] = piVar6;
            uVar13 = uVar13 + 1;
          } while (piVar6 != (inform_dist *)0x0);
          bVar14 = uVar13 < l;
        }
        if (uVar13 != 0) {
          uVar9 = 0;
          do {
            inform_dist_free((inform_dist *)__ptr_00[uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
      }
LAB_0010555f:
      bVar4 = true;
      if (bVar14) {
        local_60 = (inform_dist *)0x0;
        bVar4 = true;
      }
      else {
        local_60 = inform_dist_alloc(sVar8);
        if (local_60 == (inform_dist *)0x0) {
          if (l != 0) {
            sVar8 = 0;
            do {
              inform_dist_free((inform_dist *)__ptr_00[sVar8]);
              sVar8 = sVar8 + 1;
            } while (l != sVar8);
          }
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
        }
        else {
          bVar4 = false;
        }
      }
      if (!bVar4) {
        local_60->counts = n;
        if (l != 0) {
          sVar8 = 0;
          do {
            *(size_t *)(__ptr_00[sVar8] + 0x10) = n;
            sVar8 = sVar8 + 1;
          } while (l != sVar8);
        }
        if (n != 0) {
          puVar3 = local_60->histogram;
          sVar8 = 0;
          piVar7 = series;
          do {
            if (l == 0) {
              lVar12 = 0;
            }
            else {
              sVar11 = 0;
              lVar12 = 0;
              piVar10 = piVar7;
              do {
                lVar12 = b[sVar11] * lVar12 + (long)*piVar10;
                piVar1 = (int *)(*(long *)__ptr_00[sVar11] + (long)*piVar10 * 4);
                *piVar1 = *piVar1 + 1;
                sVar11 = sVar11 + 1;
                piVar10 = piVar10 + n;
              } while (l != sVar11);
            }
            puVar3[lVar12] = puVar3[lVar12] + 1;
            sVar8 = sVar8 + 1;
            piVar7 = piVar7 + 1;
          } while (sVar8 != n);
        }
        dVar16 = 1.0;
        if (l != 0) {
          sVar8 = 0;
          do {
            dVar16 = dVar16 * (((double)CONCAT44(0x45300000,
                                                 (int)((ulong)*(undefined8 *)
                                                               (__ptr_00[sVar8] + 0x10) >> 0x20)) -
                               1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,
                                                (int)*(undefined8 *)(__ptr_00[sVar8] + 0x10)) -
                              4503599627370496.0));
            sVar8 = sVar8 + 1;
          } while (l != sVar8);
        }
        if (n != 0) {
          uVar2 = local_60->counts;
          sVar8 = 0;
          do {
            if (l == 0) {
              dVar15 = 1.0;
              lVar12 = 0;
            }
            else {
              sVar11 = 0;
              lVar12 = 0;
              dVar15 = 1.0;
              piVar7 = series;
              do {
                dVar15 = dVar15 * (double)*(uint *)(*(long *)__ptr_00[sVar11] + (long)*piVar7 * 4);
                lVar12 = b[sVar11] * lVar12 + (long)*piVar7;
                sVar11 = sVar11 + 1;
                piVar7 = piVar7 + n;
              } while (l != sVar11);
            }
            dVar15 = log2(((double)local_60->histogram[lVar12] *
                          (dVar16 / (((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) -
                                     1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)))
                          ) / dVar15);
            __ptr[sVar8] = dVar15;
            sVar8 = sVar8 + 1;
            series = series + 1;
          } while (sVar8 != n);
        }
        inform_dist_free(local_60);
        if (l != 0) {
          sVar8 = 0;
          do {
            inform_dist_free((inform_dist *)__ptr_00[sVar8]);
            sVar8 = sVar8 + 1;
          } while (l != sVar8);
        }
        free(__ptr_00);
        return __ptr;
      }
      if (mi == (double *)0x0) {
        free(__ptr);
      }
      free(__ptr_00);
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_mutual_info(int const *series, size_t l, size_t n,
    int const *b, double *mi, inform_error *err)
{
    if (check_arguments(series, l, n, b, err)) return NULL;

    bool allocate_mi = (mi == NULL);
    if (allocate_mi)
    {
        mi = malloc(n * sizeof(double));
        if (mi == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    inform_dist **marginals = malloc(l * sizeof(inform_dist*));
    if (marginals == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    inform_dist *joint = NULL;
    if (allocate(b, l, &joint, marginals, err))
    {
        if (allocate_mi) free(mi);
        free(marginals);
        return NULL;
    }

    accumulate(series, l, n, b, joint, marginals);

    double norm = 1;
    for (size_t i = 0; i < l; ++i) norm *= marginals[i]->counts;
    norm /= joint->counts;

    double j, m;
    for (size_t i = 0; i < n; ++i)
    {
        m = 1;
        size_t joint_event = 0;
        for (size_t j = 0; j < l; ++j)
        {
            int marginal_event = series[i + n * j];
            m *= marginals[j]->histogram[marginal_event];
            joint_event = joint_event * b[j] + marginal_event;
        }
        j = joint->histogram[joint_event];
        mi[i] = log2((j * norm) / m);
    }

    free_all(&joint, marginals, l);

    return mi;
}